

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

void __thiscall cinatra::http_parser::parse_query(http_parser *this,string_view str)

{
  string_view s_00;
  bool bVar1;
  reference pbVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_bool>
  pVar7;
  size_t pos;
  basic_string_view<char,_std::char_traits<char>_> s;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  vec;
  string_view val;
  string_view key;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  size_t local_e0;
  char *local_d8;
  string_view in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_80;
  undefined1 *local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50 [24];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38);
  local_60 = local_10;
  local_58 = local_8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
  s_00._M_str = in_stack_ffffffffffffff58;
  s_00._M_len = in_stack_ffffffffffffff50;
  split_sv(s_00,in_stack_ffffffffffffff40);
  local_78 = local_50;
  local_80._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  local_88 = (basic_string_view<char,_std::char_traits<char>_> *)
             std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  bVar5._M_str = in_stack_fffffffffffffef8;
  bVar5._M_len = in_stack_ffffffffffffff00;
  bVar6._M_str = in_stack_fffffffffffffee8;
  bVar6._M_len = in_stack_fffffffffffffef0;
  do {
    bVar1 = __gnu_cxx::
            operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        *)in_stack_fffffffffffffed0._M_cur,
                       (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)in_stack_fffffffffffffee0);
      return;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&local_80);
    local_98._M_len = pbVar2->_M_len;
    local_98._M_str = pbVar2->_M_str;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_98);
    if (!bVar1) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len,
                         bVar5._M_str._7_1_,bVar6._M_len);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len,
                         bVar5._M_str._7_1_,bVar6._M_len);
      if (sVar4 == 0xffffffffffffffff) {
        local_28._M_len = local_98._M_len;
        local_28._M_str = local_98._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
        local_38._M_str = local_d8;
        local_38._M_len = local_e0;
      }
      else {
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)bVar6._M_len,
                           (size_type)bVar6._M_str,(size_type)in_stack_fffffffffffffee0);
        local_28 = bVar5;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_28);
        if (bVar1) goto LAB_0013a269;
        in_stack_fffffffffffffee0 = (basic_string_view<char,_std::char_traits<char>_> *)(sVar3 + 1);
        in_stack_fffffffffffffed8 = &local_98;
        std::basic_string_view<char,_std::char_traits<char>_>::length(in_stack_fffffffffffffed8);
        bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)bVar6._M_len,
                           (size_type)bVar6._M_str,(size_type)in_stack_fffffffffffffee0);
        local_38 = bVar6;
      }
      pVar7 = std::
              unordered_map<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>
              ::
              emplace<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                        ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffed0._M_cur);
      in_stack_fffffffffffffed0._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
           ._M_cur;
      in_stack_fffffffffffffecf = pVar7.second;
    }
LAB_0013a269:
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&local_80);
  } while( true );
}

Assistant:

void parse_query(std::string_view str) {
    std::string_view key;
    std::string_view val;

    auto vec = split_sv(str, "&");
    for (auto s : vec) {
      if (s.empty()) {
        continue;
      }
      size_t pos = s.find('=');
      if (s.find('=') != std::string_view::npos) {
        key = s.substr(0, pos);
        if (key.empty()) {
          continue;
        }
        val = s.substr(pos + 1, s.length() - pos);
      }
      else {
        key = s;
        val = "";
      }
      queries_.emplace(key, val);
    }
  }